

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_57051::DiskInterfaceTestMakeDirs::~DiskInterfaceTestMakeDirs
          (DiskInterfaceTestMakeDirs *this)

{
  DiskInterfaceTestMakeDirs *this_local;
  
  ~DiskInterfaceTestMakeDirs(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, MakeDirs) {
  string path = "path/with/double//slash/";
  EXPECT_TRUE(disk_.MakeDirs(path));
  FILE* f = fopen((path + "a_file").c_str(), "w");
  EXPECT_TRUE(f);
  EXPECT_EQ(0, fclose(f));
#ifdef _WIN32
  string path2 = "another\\with\\back\\\\slashes\\";
  EXPECT_TRUE(disk_.MakeDirs(path2.c_str()));
  FILE* f2 = fopen((path2 + "a_file").c_str(), "w");
  EXPECT_TRUE(f2);
  EXPECT_EQ(0, fclose(f2));
#endif
}